

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall
QSplitterPrivate::doMove
          (QSplitterPrivate *this,bool backwards,int hPos,int index,int delta,bool mayCollapse,
          int *positions,int *widths)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  qsizetype qVar4;
  const_reference ppQVar5;
  int *piVar6;
  int in_ECX;
  int in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  int *in_stack_00000008;
  long in_stack_00000010;
  int hs;
  int nextId;
  QWidget *w;
  QSplitterLayoutStruct *s;
  int ws;
  QWidget *in_stack_ffffffffffffff28;
  QSplitterPrivate *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b4;
  int local_ac;
  int local_9c;
  int local_98;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff6c;
  int local_84;
  QSplitterLayoutStruct *pQVar7;
  undefined1 mayCollapse_00;
  int in_stack_ffffffffffffffa8;
  undefined3 in_stack_ffffffffffffffac;
  uint index_00;
  undefined3 in_stack_ffffffffffffffbc;
  uint uVar8;
  int local_30;
  undefined1 local_2c [4];
  QSize local_28;
  int local_20;
  QPoint local_1c;
  QPoint local_14;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = CONCAT13(in_SIL,in_stack_ffffffffffffffbc) & 0x1ffffff;
  index_00 = CONCAT13(in_R9B,in_stack_ffffffffffffffac) & 0x1ffffff;
  if ((-1 < in_ECX) &&
     (lVar3 = (long)in_ECX,
     qVar4 = QList<QSplitterLayoutStruct_*>::size
                       ((QList<QSplitterLayoutStruct_*> *)(in_RDI + 0x288)), lVar3 < qVar4)) {
    ppQVar5 = QList<QSplitterLayoutStruct_*>::at
                        ((QList<QSplitterLayoutStruct_*> *)in_stack_ffffffffffffff30,
                         (qsizetype)in_stack_ffffffffffffff28);
    pQVar7 = *ppQVar5;
    local_84 = in_R8D;
    if ((uVar8 & 0x1000000) != 0) {
      local_84 = -in_R8D;
    }
    local_84 = in_ECX + local_84;
    bVar1 = QWidget::isHidden((QWidget *)0x69ba9a);
    if (bVar1) {
      collapsible((QSplitterPrivate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c);
      doMove((QSplitterPrivate *)CONCAT44(uVar8,in_EDX),SUB41((uint)in_ECX >> 0x18,0),in_R8D,
             index_00,in_stack_ffffffffffffffa8,SUB81((ulong)pQVar7 >> 0x38,0),unaff_retaddr,
             in_stack_00000008);
    }
    else {
      bVar1 = QWidget::isHidden((QWidget *)0x69bb32);
      if (bVar1) {
        local_98 = 0;
      }
      else {
        local_98 = QSplitterLayoutStruct::getHandleSize
                             ((QSplitterLayoutStruct *)in_stack_ffffffffffffff30,
                              (Orientation)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      }
      if ((uVar8 & 0x1000000) == 0) {
        local_1c = QRect::bottomRight((QRect *)in_stack_ffffffffffffff28);
        iVar2 = pick(in_stack_ffffffffffffff30,(QPoint *)in_stack_ffffffffffffff28);
        local_9c = ((iVar2 - in_EDX) - local_98) + 1;
      }
      else {
        iVar2 = in_EDX;
        local_14 = QRect::topLeft((QRect *)in_stack_ffffffffffffff28);
        local_9c = pick(in_stack_ffffffffffffff30,(QPoint *)in_stack_ffffffffffffff28);
        local_9c = in_EDX - local_9c;
        in_EDX = iVar2;
      }
      local_c = local_9c;
      if ((local_9c < 1) && (((pQVar7->field_0x14 & 1) != 0 || ((index_00 & 0x1000000) != 0)))) {
        local_c = 0;
      }
      else {
        memset(local_2c,0,4);
        QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x69bc42);
        local_28 = qSmartMaxSize(in_stack_ffffffffffffff28,(Alignment)in_stack_ffffffffffffff6c.i);
        local_20 = pick(in_stack_ffffffffffffff30,(QSize *)in_stack_ffffffffffffff28);
        piVar6 = qMin<int>(&local_c,&local_20);
        local_c = *piVar6;
        qSmartMinSize(in_stack_ffffffffffffff28);
        local_30 = pick(in_stack_ffffffffffffff30,(QSize *)in_stack_ffffffffffffff28);
        piVar6 = qMax<int>(&local_c,&local_30);
        local_c = *piVar6;
      }
      mayCollapse_00 = (undefined1)((ulong)pQVar7 >> 0x38);
      local_ac = local_98;
      if ((uVar8 & 0x1000000) != 0) {
        local_ac = -local_c;
      }
      local_ac = in_EDX + local_ac;
      in_stack_00000008[in_ECX] = local_ac;
      *(int *)(in_stack_00000010 + (long)in_ECX * 4) = local_c;
      if ((uVar8 & 0x1000000) == 0) {
        local_b4 = in_EDX + local_98 + local_c;
      }
      else {
        local_b4 = (in_EDX - local_c) - local_98;
      }
      collapsible((QSplitterPrivate *)CONCAT44(local_84,local_b4),in_stack_ffffffffffffff3c);
      doMove((QSplitterPrivate *)CONCAT44(uVar8,in_EDX),SUB41((uint)in_ECX >> 0x18,0),in_R8D,
             index_00,in_stack_ffffffffffffffa8,(bool)mayCollapse_00,unaff_retaddr,in_stack_00000008
            );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSplitterPrivate::doMove(bool backwards, int hPos, int index, int delta, bool mayCollapse,
                              int *positions, int *widths)
{
    if (index < 0 || index >= list.size())
        return;

#ifdef QSPLITTER_DEBUG
    qDebug() << "QSplitterPrivate::doMove" << backwards << hPos << index << delta << mayCollapse;
#endif

    QSplitterLayoutStruct *s = list.at(index);
    QWidget *w = s->widget;

    int nextId = backwards ? index - delta : index + delta;

    if (w->isHidden()) {
        doMove(backwards, hPos, nextId, delta, collapsible(nextId), positions, widths);
    } else {
        int hs =s->handle->isHidden() ? 0 : s->getHandleSize(orient);

        int  ws = backwards ? hPos - pick(s->rect.topLeft())
                 : pick(s->rect.bottomRight()) - hPos -hs + 1;
        if (ws > 0 || (!s->collapsed && !mayCollapse)) {
            ws = qMin(ws, pick(qSmartMaxSize(w)));
            ws = qMax(ws, pick(qSmartMinSize(w)));
        } else {
            ws = 0;
        }
        positions[index] = backwards ? hPos - ws : hPos + hs;
        widths[index] = ws;
        doMove(backwards, backwards ? hPos - ws - hs : hPos + hs + ws, nextId, delta,
               collapsible(nextId), positions, widths);
    }

}